

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_gif_main_outofmem(stbi__gif *g,stbi_uc *out,int **delays)

{
  long in_FS_OFFSET;
  
  free(g->out);
  free(g->history);
  free(g->background);
  free(out);
  if (delays != (int **)0x0) {
    free(*delays);
  }
  *(char **)(in_FS_OFFSET + -0x68) = "Out of memory";
  return "Out of memory";
}

Assistant:

static void *stbi__load_gif_main_outofmem(stbi__gif *g, stbi_uc *out, int **delays)
{
   STBI_FREE(g->out);
   STBI_FREE(g->history);
   STBI_FREE(g->background);

   if (out) STBI_FREE(out);
   if (delays && *delays) STBI_FREE(*delays);
   return stbi__errpuc("outofmem", "Out of memory");
}